

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::PackageSymbol::findForImport(PackageSymbol *this,string_view lookupName)

{
  char *pcVar1;
  group_type_pointer pgVar2;
  SymbolKind SVar3;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  long lVar4;
  WildcardImportData *pWVar5;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  ExplicitImportSymbol *this_01;
  size_t sVar8;
  pointer ppPVar9;
  uint uVar10;
  byte bVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  byte bVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  char *pcVar19;
  int iVar20;
  uint uVar21;
  uint64_t uVar22;
  Symbol *pSVar23;
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  size_type __rlen_1;
  ulong uVar28;
  Symbol *pSVar29;
  size_type __rlen;
  string_view *psVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  string_view sVar33;
  size_t pos_1;
  size_t pos;
  ulong local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  local_68._M_str = lookupName._M_str;
  local_68._M_len = lookupName._M_len;
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&this->super_Scope);
  }
  this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
            (this->super_Scope).nameMap;
  uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (this_00,&local_68);
  pcVar19 = local_68._M_str;
  sVar8 = local_68._M_len;
  uVar25 = uVar22 >> ((byte)*this_00 & 0x3f);
  lVar4 = *(long *)(this_00 + 0x10);
  lVar26 = (uVar22 & 0xff) * 4;
  cVar12 = (&UNK_00461acc)[lVar26];
  cVar13 = (&UNK_00461acd)[lVar26];
  cVar14 = (&UNK_00461ace)[lVar26];
  bVar15 = (&UNK_00461acf)[lVar26];
  uVar28 = 0;
  do {
    pcVar1 = (char *)(lVar4 + uVar25 * 0x10);
    local_48 = *pcVar1;
    cStack_47 = pcVar1[1];
    cStack_46 = pcVar1[2];
    bStack_45 = pcVar1[3];
    cStack_44 = pcVar1[4];
    cStack_43 = pcVar1[5];
    cStack_42 = pcVar1[6];
    bStack_41 = pcVar1[7];
    cStack_40 = pcVar1[8];
    cStack_3f = pcVar1[9];
    cStack_3e = pcVar1[10];
    bStack_3d = pcVar1[0xb];
    cStack_3c = pcVar1[0xc];
    cStack_3b = pcVar1[0xd];
    cStack_3a = pcVar1[0xe];
    bVar11 = pcVar1[0xf];
    auVar31[0] = -(local_48 == cVar12);
    auVar31[1] = -(cStack_47 == cVar13);
    auVar31[2] = -(cStack_46 == cVar14);
    auVar31[3] = -(bStack_45 == bVar15);
    auVar31[4] = -(cStack_44 == cVar12);
    auVar31[5] = -(cStack_43 == cVar13);
    auVar31[6] = -(cStack_42 == cVar14);
    auVar31[7] = -(bStack_41 == bVar15);
    auVar31[8] = -(cStack_40 == cVar12);
    auVar31[9] = -(cStack_3f == cVar13);
    auVar31[10] = -(cStack_3e == cVar14);
    auVar31[0xb] = -(bStack_3d == bVar15);
    auVar31[0xc] = -(cStack_3c == cVar12);
    auVar31[0xd] = -(cStack_3b == cVar13);
    auVar31[0xe] = -(cStack_3a == cVar14);
    auVar31[0xf] = -(bVar11 == bVar15);
    uVar21 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
    bStack_39 = bVar11;
    if (uVar21 != 0) {
      lVar26 = *(long *)(this_00 + 0x18) + uVar25 * 0x168;
      do {
        uVar10 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        lVar27 = (ulong)uVar10 * 0x18;
        if ((sVar8 == *(size_t *)(lVar26 + lVar27)) &&
           ((sVar8 == 0 ||
            (iVar20 = bcmp(pcVar19,*(void **)(lVar26 + 8 + lVar27),sVar8), iVar20 == 0)))) {
          psVar30 = (string_view *)(lVar26 + lVar27 + 0x10);
          while( true ) {
            this_01 = (ExplicitImportSymbol *)psVar30->_M_len;
            SVar3 = (this_01->super_Symbol).kind;
            if (SVar3 != TransparentMember) break;
            psVar30 = &this_01->packageName;
          }
          if (SVar3 == ForwardingTypedef) {
            return (Symbol *)0x0;
          }
          if (SVar3 != ExplicitImport) {
            return &this_01->super_Symbol;
          }
          pSVar23 = ExplicitImportSymbol::importedSymbol(this_01);
          return pSVar23;
        }
        uVar21 = uVar21 - 1 & uVar21;
      } while (uVar21 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bVar11) == 0) break;
    lVar26 = uVar25 + uVar28;
    uVar28 = uVar28 + 1;
    uVar25 = lVar26 + 1U & *(ulong *)(this_00 + 8);
  } while (uVar28 <= *(ulong *)(this_00 + 8));
  pWVar5 = (this->super_Scope).importData;
  if ((pWVar5 != (WildcardImportData *)0x0) &&
     ((this->hasExportAll != false || ((this->exportDecls)._M_extent._M_extent_value != 0)))) {
    if (pWVar5->hasForceElaborated == false) {
      pWVar5->hasForceElaborated = true;
      Compilation::forceElaborate((this->super_Scope).compilation,&this->super_Symbol);
    }
    uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &pWVar5->importedSymbols,&local_68);
    pcVar19 = local_68._M_str;
    sVar8 = local_68._M_len;
    uVar25 = uVar22 >> ((byte)(pWVar5->importedSymbols).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                              .arrays.groups_size_index & 0x3f);
    pgVar6 = (pWVar5->importedSymbols).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
             .arrays.groups_;
    lVar26 = (uVar22 & 0xff) * 4;
    uVar16 = (&UNK_00461acc)[lVar26];
    uVar17 = (&UNK_00461acd)[lVar26];
    uVar18 = (&UNK_00461ace)[lVar26];
    bVar15 = (&UNK_00461acf)[lVar26];
    local_a0 = 0;
    do {
      pgVar2 = pgVar6 + uVar25;
      local_58 = pgVar2->m[0].n;
      uStack_57 = pgVar2->m[1].n;
      uStack_56 = pgVar2->m[2].n;
      bStack_55 = pgVar2->m[3].n;
      uStack_54 = pgVar2->m[4].n;
      uStack_53 = pgVar2->m[5].n;
      uStack_52 = pgVar2->m[6].n;
      bStack_51 = pgVar2->m[7].n;
      uStack_50 = pgVar2->m[8].n;
      uStack_4f = pgVar2->m[9].n;
      uStack_4e = pgVar2->m[10].n;
      bStack_4d = pgVar2->m[0xb].n;
      uStack_4c = pgVar2->m[0xc].n;
      uStack_4b = pgVar2->m[0xd].n;
      uStack_4a = pgVar2->m[0xe].n;
      bVar11 = pgVar2->m[0xf].n;
      auVar32[0] = -(local_58 == uVar16);
      auVar32[1] = -(uStack_57 == uVar17);
      auVar32[2] = -(uStack_56 == uVar18);
      auVar32[3] = -(bStack_55 == bVar15);
      auVar32[4] = -(uStack_54 == uVar16);
      auVar32[5] = -(uStack_53 == uVar17);
      auVar32[6] = -(uStack_52 == uVar18);
      auVar32[7] = -(bStack_51 == bVar15);
      auVar32[8] = -(uStack_50 == uVar16);
      auVar32[9] = -(uStack_4f == uVar17);
      auVar32[10] = -(uStack_4e == uVar18);
      auVar32[0xb] = -(bStack_4d == bVar15);
      auVar32[0xc] = -(uStack_4c == uVar16);
      auVar32[0xd] = -(uStack_4b == uVar17);
      auVar32[0xe] = -(uStack_4a == uVar18);
      auVar32[0xf] = -(bVar11 == bVar15);
      uVar21 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
      if (uVar21 != 0) {
        ppVar7 = (pWVar5->importedSymbols).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                 .arrays.elements_;
        bStack_49 = bVar11;
        do {
          uVar10 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar28 = (ulong)uVar10;
          if ((sVar8 == ppVar7[uVar25 * 0xf + uVar28].first._M_len) &&
             ((sVar8 == 0 ||
              (iVar20 = bcmp(pcVar19,ppVar7[uVar25 * 0xf + uVar28].first._M_str,sVar8), iVar20 == 0)
              ))) {
            pSVar23 = ppVar7[uVar25 * 0xf + uVar28].second;
            pSVar29 = pSVar23;
            if (this->hasExportAll != false) {
              return pSVar23;
            }
            do {
              pSVar29 = pSVar29->parentScope->thisSym;
            } while (pSVar29->kind != Package);
            sVar8 = (this->exportDecls)._M_extent._M_extent_value;
            if (sVar8 == 0) {
              return (Symbol *)0x0;
            }
            ppPVar9 = (this->exportDecls)._M_ptr;
            lVar26 = 0;
            do {
              lVar4 = *(long *)((long)ppPVar9 + lVar26);
              sVar33 = parsing::Token::valueText((Token *)(lVar4 + 0x18));
              sVar24 = sVar33._M_len;
              if ((sVar24 == (pSVar29->name)._M_len) &&
                 ((sVar24 == 0 ||
                  (iVar20 = bcmp(sVar33._M_str,*(char **)((long)&pSVar29->name + 8),sVar24),
                  iVar20 == 0)))) {
                if (*(short *)(lVar4 + 0x38) == 0x1b) {
                  return pSVar23;
                }
                sVar33 = parsing::Token::valueText((Token *)(lVar4 + 0x38));
                sVar24 = sVar33._M_len;
                if (sVar24 == (pSVar23->name)._M_len) {
                  if (sVar24 == 0) {
                    return pSVar23;
                  }
                  iVar20 = bcmp(sVar33._M_str,*(char **)((long)&pSVar23->name + 8),sVar24);
                  if (iVar20 == 0) {
                    return pSVar23;
                  }
                }
              }
              lVar26 = lVar26 + 8;
              if (sVar8 << 3 == lVar26) {
                return (Symbol *)0x0;
              }
            } while( true );
          }
          uVar21 = uVar21 - 1 & uVar21;
        } while (uVar21 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bVar11) == 0) {
        return (Symbol *)0x0;
      }
      uVar28 = (pWVar5->importedSymbols).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_size_mask;
      lVar26 = uVar25 + local_a0;
      local_a0 = local_a0 + 1;
      uVar25 = lVar26 + 1U & uVar28;
    } while (local_a0 <= uVar28);
  }
  return (Symbol *)0x0;
}

Assistant:

const Symbol* PackageSymbol::findForImport(std::string_view lookupName) const {
    auto& scopeNameMap = getNameMap();
    if (auto it = scopeNameMap.find(lookupName); it != scopeNameMap.end()) {
        auto symbol = it->second;
        while (symbol->kind == SymbolKind::TransparentMember)
            symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

        switch (symbol->kind) {
            case SymbolKind::ExplicitImport:
                return symbol->as<ExplicitImportSymbol>().importedSymbol();
            case SymbolKind::ForwardingTypedef:
                return nullptr;
            default:
                return symbol;
        }
    }

    auto wildcardData = getWildcardImportData();
    if (!wildcardData || (!hasExportAll && exportDecls.empty()))
        return nullptr;

    // We need to force-elaborate the entire package body because any
    // lookups that result in a wildcard import could add to our export list.
    if (!wildcardData->hasForceElaborated) {
        wildcardData->hasForceElaborated = true;
        getCompilation().forceElaborate(*this);
    }

    // Look through symbols that have been wildcard imported with this name.
    if (auto it = wildcardData->importedSymbols.find(lookupName);
        it != wildcardData->importedSymbols.end()) {

        auto symbol = it->second;
        if (hasExportAll)
            return symbol;

        // If we don't have an export-all directive then we need to check
        // whether we wanted to actually export this symbol.
        // First find the package that owns the target symbol.
        const Symbol* packageParent;
        auto targetScope = symbol->getParentScope();
        while (true) {
            SLANG_ASSERT(targetScope);
            packageParent = &targetScope->asSymbol();
            if (packageParent->kind == SymbolKind::Package)
                break;

            targetScope = packageParent->getParentScope();
        }

        // Now look for a matching export.
        for (auto decl : exportDecls) {
            if (decl->package.valueText() != packageParent->name)
                continue;

            if (decl->item.kind == TokenKind::Star || decl->item.valueText() == symbol->name)
                return symbol;
        }
    }

    return nullptr;
}